

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

string * __thiscall
Panel::writeXml_abi_cxx11_(string *__return_storage_ptr__,Panel *this,int indent)

{
  ostream *poVar1;
  int level;
  int level_00;
  stringstream str;
  allocator local_1f1;
  string local_1f0;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  Util::getIndent_abi_cxx11_(&local_1f0,(Util *)(ulong)(uint)indent,level);
  poVar1 = std::operator<<(local_1a0,(string *)&local_1f0);
  std::operator<<(poVar1,"<Panel");
  std::__cxx11::string::~string((string *)&local_1f0);
  Widget::writeXmlAttributes(&this->super_Widget,(stringstream *)local_1b0);
  poVar1 = std::operator<<(local_1a0,">");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string((string *)&local_1d0,"BackgroundColor",&local_1f1);
  Color::writeXml(&local_1f0,&this->backgroundColor,indent + 1,&local_1d0);
  std::operator<<(local_1a0,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  Widget::writeXmlChildren(&this->super_Widget,(stringstream *)local_1b0,indent + 1);
  Util::getIndent_abi_cxx11_(&local_1f0,(Util *)(ulong)(uint)indent,level_00);
  poVar1 = std::operator<<(local_1a0,(string *)&local_1f0);
  std::operator<<(poVar1,"</Panel>");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string Panel::writeXml(int indent)
{
	std::stringstream str;
	str << Util::getIndent(indent) << "<Panel";
	writeXmlAttributes(str);

	str << ">" << std::endl;
	str << backgroundColor.writeXml(indent + 1, "BackgroundColor");
	
	writeXmlChildren(str, indent + 1);
	
	str << Util::getIndent(indent) << "</Panel>";
	return str.str();
}